

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::internal::ThousandsSep::operator()(ThousandsSep *this,wchar_t **buffer)

{
  size_t sVar1;
  wchar_t *pwVar2;
  char *__first;
  uint uVar3;
  
  uVar3 = this->digit_index_ + 1;
  this->digit_index_ = uVar3;
  if (uVar3 % 3 != 0) {
    return;
  }
  sVar1 = (this->sep_).size_;
  pwVar2 = *buffer;
  *buffer = pwVar2 + -sVar1;
  __first = (this->sep_).data_;
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char_const*,wchar_t*>
            (__first,__first + sVar1,pwVar2 + -sVar1);
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_ptr(buffer, sep_.size()));
  }